

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_wstring_with_u32string_literal(void)

{
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"bravo");
  local_a[0] = trial::dynamic::operator<(&local_48,(char32_t (*) [6])L"bravo");
  local_49 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d2e,"void relational_suite::compare_wstring_with_u32string_literal()",local_a,
             &local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,L"bravo");
  local_5e[0] = trial::dynamic::operator<=(&local_98,(char32_t (*) [6])L"bravo");
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d2f,"void relational_suite::compare_wstring_with_u32string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  local_9b[0] = trial::dynamic::operator>(&local_d8,(char32_t (*) [6])L"bravo");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d30,"void relational_suite::compare_wstring_with_u32string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,L"bravo");
  local_db[0] = trial::dynamic::operator>=(&local_118,(char32_t (*) [6])L"bravo");
  local_119 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d31,"void relational_suite::compare_wstring_with_u32string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"bravo");
  local_11b[0] = trial::dynamic::operator<(&local_158,(char32_t (*) [5])L"zulu");
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < U\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d33,"void relational_suite::compare_wstring_with_u32string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  local_15b[0] = trial::dynamic::operator<=(&local_198,(char32_t (*) [5])L"zulu");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= U\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d34,"void relational_suite::compare_wstring_with_u32string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,L"bravo");
  local_19b[0] = trial::dynamic::operator>(&local_1d8,(char32_t (*) [5])L"zulu");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > U\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d35,"void relational_suite::compare_wstring_with_u32string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,L"bravo");
  local_1db[0] = trial::dynamic::operator>=(&local_218,(char32_t (*) [5])L"zulu");
  local_219 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= U\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d36,"void relational_suite::compare_wstring_with_u32string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,L"zulu");
  local_21b[0] = trial::dynamic::operator<(&local_258,(char32_t (*) [6])L"bravo");
  local_259 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") < U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d38,"void relational_suite::compare_wstring_with_u32string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,L"zulu");
  local_25b[0] = trial::dynamic::operator<=(&local_298,(char32_t (*) [6])L"bravo");
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") <= U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d39,"void relational_suite::compare_wstring_with_u32string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2d8,L"zulu");
  local_29b[0] = trial::dynamic::operator>(&local_2d8,(char32_t (*) [6])L"bravo");
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") > U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d3a,"void relational_suite::compare_wstring_with_u32string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"zulu");
  local_2db[0] = trial::dynamic::operator>=(&local_318,(char32_t (*) [6])L"bravo");
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"zulu\") >= U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1d3b,"void relational_suite::compare_wstring_with_u32string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  return;
}

Assistant:

void compare_wstring_with_u32string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < U"bravo", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= U"bravo", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > U"bravo", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= U"bravo", false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < U"zulu", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= U"zulu", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > U"zulu", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= U"zulu", false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") < U"bravo", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") <= U"bravo", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") > U"bravo", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"zulu") >= U"bravo", false);
}